

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Benchmark::Benchmark::run<std::chrono::_V2::steady_clock>(Benchmark *this)

{
  pointer pcVar1;
  Environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> EVar2;
  undefined8 *puVar3;
  IResultCapture *pIVar4;
  anon_class_24_3_fd67980c *fun;
  anon_class_24_3_b965e527 *fun_00;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
  in_R8;
  IConfigPtr cfg;
  CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7339:46)>_>
  samples;
  BenchmarkInfo info;
  BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> stats;
  Environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> env;
  SampleAnalysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> analysis;
  Detail *local_248;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_240;
  CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7339:46)>_>
  local_230;
  long *local_218;
  long local_210;
  long local_208 [2];
  rep local_1f8;
  int iStack_1f0;
  undefined4 uStack_1ec;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  _Tuple_impl<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
  _Stack_1e0;
  undefined8 local_1d8;
  CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7323:43)>_>
  *local_1d0;
  CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7323:43)>_>
  *local_1c8;
  Benchmark *local_1c0 [2];
  rep local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  callable *pcStack_198;
  undefined8 local_190;
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  local_188;
  rep local_170;
  rep rStack_168;
  rep local_160;
  double dStack_158;
  rep local_150;
  rep rStack_148;
  rep local_140;
  double dStack_138;
  OutlierClassification local_130;
  double local_118;
  CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7323:43)>_>
  local_110;
  Benchmark local_e8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  SampleAnalysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> local_a8;
  
  if (IMutableContext::currentContext == (long *)0x0) {
    IMutableContext::createContext();
  }
  puVar3 = (undefined8 *)(**(code **)(*IMutableContext::currentContext + 0x20))();
  local_248 = (Detail *)*puVar3;
  local_240 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar3[1];
  if (local_240 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_240->_M_use_count = local_240->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_240->_M_use_count = local_240->_M_use_count + 1;
    }
  }
  Detail::measure_environment<std::chrono::_V2::steady_clock>();
  pIVar4 = getResultCapture();
  (*pIVar4->_vptr_IResultCapture[6])(pIVar4,&this->name);
  local_1d0 = (CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7323:43)>_>
               *)&local_248;
  local_1c8 = (CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7323:43)>_>
               *)&local_e8;
  local_1c0[0] = this;
  user_code<Catch::Benchmark::Benchmark::run<std::chrono::_V2::steady_clock>()::_lambda()_1_>
            (&local_110,(Benchmark *)&local_1d0,fun);
  pcVar1 = (this->name)._M_dataplus._M_p;
  local_218 = local_208;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_218,pcVar1,pcVar1 + (this->name)._M_string_length);
  local_1f8 = local_110.estimated_duration.__r;
  iStack_1f0 = local_110.iterations_per_sample;
  uStack_1ec = (**(code **)(*(long *)local_248 + 0xb0))();
  local_1e8 = (**(code **)(*(long *)local_248 + 0xc0))();
  _Stack_1e0.super__Head_base<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_false>.
  _M_head_impl = (_Head_base<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_false>)
                 (_Head_base<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_false>)
                 local_e8.fun.f._M_t.
                 super___uniq_ptr_impl<Catch::Benchmark::Detail::BenchmarkFunction::callable,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
                 .
                 super__Head_base<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_false>
                 ._M_head_impl;
  local_1d8 = local_e8.name.field_2._8_8_;
  pIVar4 = getResultCapture();
  (*pIVar4->_vptr_IResultCapture[7])(pIVar4,&local_218);
  local_1d0 = &local_110;
  local_1c8 = (CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7323:43)>_>
               *)&local_248;
  local_1c0[0] = &local_e8;
  user_code<Catch::Benchmark::Benchmark::run<std::chrono::_V2::steady_clock>()::_lambda()_2_>
            (&local_230,(Benchmark *)&local_1d0,fun_00);
  EVar2.clock_resolution.outliers._0_8_ = local_e8.name._M_dataplus._M_p;
  EVar2.clock_resolution.mean.__r =
       (rep)local_e8.fun.f._M_t.
            super___uniq_ptr_impl<Catch::Benchmark::Detail::BenchmarkFunction::callable,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
            ._M_t.
            super__Tuple_impl<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
            .super__Head_base<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_false>.
            _M_head_impl;
  EVar2.clock_resolution.outliers.low_mild = (undefined4)local_e8.name._M_string_length;
  EVar2.clock_resolution.outliers.high_mild = local_e8.name._M_string_length._4_4_;
  EVar2.clock_resolution._24_8_ = local_e8.name.field_2._M_allocated_capacity;
  EVar2.clock_cost.mean.__r = (rep)local_e8.name.field_2._8_8_;
  EVar2.clock_cost.outliers.samples_seen = (undefined4)uStack_c0;
  EVar2.clock_cost.outliers.low_severe = uStack_c0._4_4_;
  EVar2.clock_cost.outliers.low_mild = (undefined4)local_b8;
  EVar2.clock_cost.outliers.high_mild = local_b8._4_4_;
  EVar2.clock_cost._24_8_ = uStack_b0;
  Detail::
  analyse<std::chrono::duration<double,std::ratio<1l,1000000000l>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>>
            (&local_a8,local_248,
             (IConfig *)
             local_230.
             super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,EVar2,
             (__normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
              )local_230.
               super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,in_R8);
  local_1d0 = (CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7323:43)>_>
               *)local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,local_218,local_210 + (long)local_218);
  local_190 = local_1d8;
  uStack_1a8 = CONCAT44(uStack_1ec,iStack_1f0);
  local_1a0 = CONCAT44(uStack_1e4,local_1e8);
  pcStack_198 = (callable *)
                _Stack_1e0.
                super__Head_base<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_false>
                ._M_head_impl;
  local_1b0 = local_1f8;
  std::
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  ::vector(&local_188,&local_a8.samples);
  local_160 = local_a8.mean.upper_bound.__r;
  dStack_158 = local_a8.mean.confidence_interval;
  local_170 = local_a8.mean.point.__r;
  rStack_168 = local_a8.mean.lower_bound.__r;
  local_150 = local_a8.standard_deviation.point.__r;
  rStack_148 = local_a8.standard_deviation.lower_bound.__r;
  local_140 = local_a8.standard_deviation.upper_bound.__r;
  dStack_138 = local_a8.standard_deviation.confidence_interval;
  local_130.samples_seen = local_a8.outliers.samples_seen;
  local_130.low_severe = local_a8.outliers.low_severe;
  local_130.low_mild = local_a8.outliers.low_mild;
  local_130.high_mild = local_a8.outliers.high_mild;
  local_130.high_severe = local_a8.outliers.high_severe;
  local_118 = local_a8.outlier_variance;
  pIVar4 = getResultCapture();
  (*pIVar4->_vptr_IResultCapture[8])(pIVar4,&local_1d0);
  if (local_188.
      super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.
                    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_188.
                          super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.
                          super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1d0 !=
      (CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7323:43)>_>
       *)local_1c0) {
    operator_delete(local_1d0,
                    (ulong)((long)&(local_1c0[0]->fun).f._M_t.
                                   super___uniq_ptr_impl<Catch::Benchmark::Detail::BenchmarkFunction::callable,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
                                   .
                                   super__Head_base<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_false>
                                   ._M_head_impl + 1));
  }
  if (local_a8.samples.
      super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.samples.
                    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.samples.
                          super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.samples.
                          super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_230.
      super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_230.
                    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_230.
                          super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_230.
                          super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_218 != local_208) {
    operator_delete(local_218,local_208[0] + 1);
  }
  if (local_110.benchmark.f._M_t.
      super___uniq_ptr_impl<Catch::Benchmark::Detail::BenchmarkFunction::callable,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
      .super__Head_base<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_data<Catch::Benchmark::Detail::BenchmarkFunction::callable,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_110.benchmark.f._M_t.
        super___uniq_ptr_impl<Catch::Benchmark::Detail::BenchmarkFunction::callable,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
        ._M_t.
        super__Tuple_impl<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
        .super__Head_base<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_false>.
        _M_head_impl)[3])();
  }
  if (local_240 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_240);
  }
  return;
}

Assistant:

void run() {
                IConfigPtr cfg = getCurrentContext().getConfig();

                auto env = Detail::measure_environment<Clock>();

                getResultCapture().benchmarkPreparing(name);
                CATCH_TRY{
                    auto plan = user_code([&] {
                        return prepare<Clock>(*cfg, env);
                    });

                    BenchmarkInfo info {
                        name,
                        plan.estimated_duration.count(),
                        plan.iterations_per_sample,
                        cfg->benchmarkSamples(),
                        cfg->benchmarkResamples(),
                        env.clock_resolution.mean.count(),
                        env.clock_cost.mean.count()
                    };

                    getResultCapture().benchmarkStarting(info);

                    auto samples = user_code([&] {
                        return plan.template run<Clock>(*cfg, env);
                    });

                    auto analysis = Detail::analyse(*cfg, env, samples.begin(), samples.end());
                    BenchmarkStats<FloatDuration<Clock>> stats{ info, analysis.samples, analysis.mean, analysis.standard_deviation, analysis.outliers, analysis.outlier_variance };
                    getResultCapture().benchmarkEnded(stats);

                }